

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_ClassArray<ON_SubDEdgePtr> * __thiscall
ON_ClassArray<ON_SubDEdgePtr>::operator=
          (ON_ClassArray<ON_SubDEdgePtr> *this,ON_ClassArray<ON_SubDEdgePtr> *src)

{
  int iVar1;
  ON_SubDEdgePtr *pOVar2;
  ON_SubDEdgePtr *pOVar3;
  long lVar4;
  
  if (this != src) {
    iVar1 = src->m_count;
    if ((long)iVar1 < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < iVar1) {
        SetCapacity(this,(long)iVar1);
      }
      pOVar2 = this->m_a;
      if (pOVar2 != (ON_SubDEdgePtr *)0x0) {
        iVar1 = src->m_count;
        this->m_count = iVar1;
        if (0 < (long)iVar1) {
          pOVar3 = src->m_a;
          lVar4 = 0;
          do {
            pOVar2[lVar4].m_ptr = pOVar3[lVar4].m_ptr;
            lVar4 = lVar4 + 1;
          } while (iVar1 != lVar4);
        }
      }
    }
  }
  return this;
}

Assistant:

ON_ClassArray<T>& ON_ClassArray<T>::operator=( const ON_ClassArray<T>& src )
{
  int i;
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        for ( i = 0; i < m_count; i++ ) {
          m_a[i] = src.m_a[i];
        }
      }
    }
  }  
  return *this;
}